

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson_encoder_tests.cpp
# Opt level: O2

void anon_unknown.dwarf_cb579::check_equal
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *v,
               vector<unsigned_char,_std::allocator<unsigned_char>_> *expected)

{
  json j;
  vector<unsigned_char,_std::allocator<unsigned_char>_> u;
  bson_encode_options local_28;
  
  test_equal(v,expected);
  u.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)CONCAT44(u.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                         .super__Vector_impl_data._M_end_of_storage._4_4_,0x400);
  u.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = jsoncons::bson::bson_decode_options::vtable + 0x18;
  u.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = jsoncons::bson::bson_decode_options::vtable + 0x40;
  jsoncons::bson::
  decode_bson<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>>
            ((bson *)&j,v,(bson_decode_options *)&u);
  u.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  u.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  u.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_28._16_4_ = 0x400;
  local_28._vptr_bson_encode_options =
       (_func_int **)(jsoncons::bson::bson_encode_options::vtable + 0x18);
  local_28._8_8_ = 0x997de8;
  jsoncons::bson::
  encode_bson<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>>
            (&j,&u,&local_28);
  test_equal(v,&u);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&u.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::~basic_json(&j);
  return;
}

Assistant:

void check_equal(const std::vector<uint8_t>& v, const std::vector<uint8_t>& expected)
    {
        test_equal(v, expected);
        JSONCONS_TRY
        {
            json j = bson::decode_bson<json>(v);
            std::vector<uint8_t> u;
            bson::encode_bson(j, u);
            test_equal(v,u);
        }